

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImportMemory
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits)

{
  Enum EVar1;
  char local_a8 [8];
  char buf [100];
  Index import_index_local;
  BinaryReaderLogging *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  anon_unknown_21::SPrintLimits(local_a8,100,page_limits);
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnImportMemory(import_index: %u, memory_index: %u, %s)\n",
                 (ulong)import_index,(ulong)memory_index,local_a8);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x12])
                    (this->reader_,(ulong)import_index,module_name.data_,module_name.size_,
                     field_name.data_,field_name.size_,memory_index,page_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportMemory(Index import_index,
                                           string_view module_name,
                                           string_view field_name,
                                           Index memory_index,
                                           const Limits* page_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), page_limits);
  LOGF("OnImportMemory(import_index: %" PRIindex ", memory_index: %" PRIindex
       ", %s)\n",
       import_index, memory_index, buf);
  return reader_->OnImportMemory(import_index, module_name, field_name,
                                 memory_index, page_limits);
}